

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O3

void __thiscall
chrono::ChTimestepperRungeKuttaExpl::ChTimestepperRungeKuttaExpl
          (ChTimestepperRungeKuttaExpl *this,ChIntegrable *intgr)

{
  ChTimestepperIorder::ChTimestepperIorder(&this->super_ChTimestepperIorder,intgr);
  (this->super_ChTimestepperIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperRungeKuttaExpl_00b432c8;
  ChState::ChState(&this->y_new,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Dydt1,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Dydt2,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Dydt3,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Dydt4,(ChIntegrable *)0x0);
  return;
}

Assistant:

virtual Type GetType() const override { return Type::RUNGEKUTTA45; }